

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

void __thiscall Nibbler::getRemainder(Nibbler *this,string *result)

{
  string local_30 [32];
  
  if (this->_cursor < this->_length) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)this);
    std::__cxx11::string::operator=((string *)result,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void Nibbler::getRemainder (std::string& result)
{
  if (_cursor < _length)
    result = _input.substr (_cursor);
}